

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator,mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
          (internal *this,char *expected_expression,char *actual_expression,iterator *expected,
          iterator *actual)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  iterator *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar5;
  BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  rhs;
  string local_68;
  string local_48;
  iterator *value;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  
  uVar1 = (actual->item_).
          super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  uVar2 = (actual->item_).
          super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  rhs.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ = uVar2;
  rhs.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (BasicProblem<mp::BasicProblemParams<int>_> *)uVar1;
  rhs.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
  bVar3 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>
          ::operator==((BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>
                        *)expected,rhs);
  if (bVar3) {
    AVar5 = AssertionSuccess();
    sVar4 = AVar5.message_.ptr_;
  }
  else {
    PrintToString<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
              (&local_48,(testing *)expected,value);
    PrintToString<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
              (&local_68,(testing *)actual,value_00);
    AVar5 = EqFailure(this,expected_expression,actual_expression,&local_48,&local_68,false);
    sVar4 = AVar5.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      sVar4.ptr_ = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      sVar4.ptr_ = extraout_RDX_00;
    }
  }
  AVar5.message_.ptr_ = sVar4.ptr_;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}